

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  cmFunctionBlocker **ppcVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  ostream *poVar5;
  cmListFileContext *in_RCX;
  ulong uVar6;
  cmFunctionBlocker *pcVar7;
  const_iterator __position;
  ostringstream e;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  lVar2 = fb[10].StartingContext.Line;
  if (*(long *)((long)&fb[10].StartingContext.FilePath.field_2 + 8) == lVar2) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ulong *)(lVar2 + -8);
  }
  __position._M_current = (cmFunctionBlocker **)fb[10].StartingContext.FilePath._M_string_length;
  uVar6 = (long)__position._M_current - (long)fb[10].StartingContext.FilePath._M_dataplus._M_p >> 3;
  pcVar7 = (cmFunctionBlocker *)0x0;
  do {
    if (uVar6 <= uVar4) goto LAB_002edce1;
    uVar6 = uVar6 - 1;
    ppcVar1 = __position._M_current + -1;
    __position._M_current = __position._M_current + -1;
  } while ((cmListFileFunction *)*ppcVar1 != lff);
  cVar3 = (**(code **)((((cmListFileFunction *)*ppcVar1)->super_cmListFileContext).Name._M_dataplus.
                       _M_p + 8))();
  if (cVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar5 = std::operator<<((ostream *)local_1a8,"A logical block opening on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = operator<<(poVar5,(cmListFileContext *)
                               &(lff->super_cmListFileContext).Name._M_string_length);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"closes on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = operator<<(poVar5,in_RCX);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"with mis-matching arguments.");
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  pcVar7 = *__position._M_current;
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::erase
            ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
             &fb[10].StartingContext.FilePath,__position);
LAB_002edce1:
  (this->Internal).x_ = (Internals *)pcVar7;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

cmsys::auto_ptr<cmFunctionBlocker>
cmMakefile::RemoveFunctionBlocker(cmFunctionBlocker* fb,
                                  const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if(!this->FunctionBlockerBarriers.empty())
    {
    barrier = this->FunctionBlockerBarriers.back();
    }

  // Search for the function blocker whose scope this command ends.
  for(FunctionBlockersType::size_type
        i = this->FunctionBlockers.size(); i > barrier; --i)
    {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb)
      {
      // Warn if the arguments do not match, but always remove.
      if(!(*pos)->ShouldRemove(lff, *this))
        {
        cmListFileContext const& lfc = fb->GetStartingContext();
        std::ostringstream e;
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << lff << "\n"
          << "with mis-matching arguments.";
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return cmsys::auto_ptr<cmFunctionBlocker>(b);
      }
    }

  return cmsys::auto_ptr<cmFunctionBlocker>();
}